

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall Filter::update(Filter *this,vector<float,_std::allocator<float>_> *newData)

{
  float fVar1;
  pointer pfVar2;
  float *pfVar3;
  int i;
  long lVar4;
  
  for (lVar4 = 0;
      (lVar4 < this->measSize &&
      (pfVar2 = (newData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start,
      lVar4 != (long)(newData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar2 >> 2)); lVar4 = lVar4 + 1) {
    fVar1 = pfVar2[lVar4];
    pfVar3 = cv::Mat::at<float>(&this->meas,(int)lVar4);
    *pfVar3 = fVar1;
  }
  return;
}

Assistant:

void Filter::update(const vector<float> newData) {
    for (int i = 0; i < measSize; i++) {
        if (newData.size() == i)
            return;
        meas.at<float>(i) = newData[i];
    }
}